

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::markSequence(MidiFile *this,int track,int sequence)

{
  int iVar1;
  MidiEventList *this_00;
  ostream *poVar2;
  int sequence_local;
  int track_local;
  MidiFile *this_local;
  
  if ((-1 < track) && (iVar1 = getTrackCount(this), track < iVar1)) {
    this_00 = operator[](this,track);
    MidiEventList::markSequence(this_00,sequence);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: track ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,track);
  poVar2 = std::operator<<(poVar2," does not exist.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void MidiFile::markSequence(int track, int sequence) {
	if ((track >= 0) && (track < getTrackCount())) {
		operator[](track).markSequence(sequence);
	} else {
		std::cerr << "Warning: track " << track << " does not exist." << std::endl;
	}
}